

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

ze_image_flag_t to_flag(string *flag)

{
  long lVar1;
  long lVar2;
  ze_image_flag_t zVar3;
  
  lVar1 = std::__cxx11::string::find((char *)flag,0x1098f2);
  lVar2 = std::__cxx11::string::find((char *)flag,0x1098f8);
  zVar3 = (lVar1 != -1) + ZE_IMAGE_FLAG_BIAS_UNCACHED;
  if (lVar2 == -1) {
    zVar3 = (uint)(lVar1 != -1);
  }
  return zVar3;
}

Assistant:

ze_image_flag_t to_flag(const std::string flag) {

  // by default setting to READ
  ze_image_flag_t image_flags = {};

  // check if "READ" position is found in flag string
  if (flag.find("WRITE") != std::string::npos) {
    image_flags =
        static_cast<ze_image_flag_t>(image_flags | ZE_IMAGE_FLAG_KERNEL_WRITE);
  }
  if (flag.find("UNCACHED") != std::string::npos) {
    image_flags =
        static_cast<ze_image_flag_t>(image_flags | ZE_IMAGE_FLAG_BIAS_UNCACHED);
  }

  return image_flags;
}